

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this)

{
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this_local;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00c9ac80;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00c9ad30;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00c9ad78;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00c9adb0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00c9adc8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00c9ade0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00c9ae10;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00c9ae50;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00c9ae68;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00c9ae88;
  (this->super_Delegate)._vptr_Delegate =
       (_func_int **)&PTR_card_did_change_select_constraints_00c9aea0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  JoystickPair::~JoystickPair(&this->joysticks_);
  Keyboard::~Keyboard(&this->keyboard_);
  std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::~vector
            (&this->just_in_time_cards_);
  std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::~vector
            (&this->every_cycle_cards_);
  std::array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>::~array
            (&this->cards_);
  Outputs::Speaker::PullLowpass<Audio::Toggle>::~PullLowpass(&this->speaker_);
  Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>::
  ~CompoundSource(&this->mixer_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->rom_);
  II::Video::
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::VideoBusHandler,_true>
  ::~Video(&this->video_);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  II::Machine::~Machine(&this->super_Machine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}